

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessBYE
          (RTPSources *this,uint32_t ssrc,size_t reasonlength,void *reasondata,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  bool bVar1;
  bool prevactive;
  int status;
  bool created;
  RTPInternalSourceData *srcdat;
  RTPAddress *senderaddress_local;
  RTPTime *receivetime_local;
  void *reasondata_local;
  size_t reasonlength_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat = (RTPInternalSourceData *)senderaddress;
  senderaddress_local = (RTPAddress *)receivetime;
  receivetime_local = (RTPTime *)reasondata;
  reasondata_local = (void *)reasonlength;
  reasonlength_local._4_4_ = ssrc;
  pRStack_18 = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,&prevactive);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else if (_status == this->owndata) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = RTPSourceData::IsActive(&_status->super_RTPSourceData);
      RTPInternalSourceData::ProcessBYEPacket
                (_status,(uint8_t *)receivetime_local,(size_t)reasondata_local,
                 (RTPTime *)senderaddress_local);
      if ((bVar1) && (bVar1 = RTPSourceData::IsActive(&_status->super_RTPSourceData), !bVar1)) {
        this->activecount = this->activecount + -1;
      }
      if ((prevactive & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[10])(this,_status);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessBYE(uint32_t ssrc,size_t reasonlength,const void *reasondata,
		           const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	bool prevactive;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	// we'll ignore BYE packets for our own ssrc
	if (srcdat == owndata)
		return 0;
	
	prevactive = srcdat->IsActive();
	srcdat->ProcessBYEPacket((const uint8_t *)reasondata,reasonlength,receivetime);
	if (prevactive && !srcdat->IsActive())
		activecount--;
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);
	OnBYEPacket(srcdat);
	return 0;
}